

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O0

void __thiscall
jsonnet::internal::FixIndentation::specs
          (FixIndentation *this,
          vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
          *specs,Indent *indent)

{
  bool bVar1;
  reference this_00;
  size_type sVar2;
  FixIndentation *in_RDI;
  Indent new_indent_1;
  Indent new_indent;
  ComprehensionSpec *spec;
  iterator __end2;
  iterator __begin2;
  vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
  *__range2;
  undefined1 in_stack_000005ef;
  Indent *in_stack_000005f0;
  AST *in_stack_000005f8;
  FixIndentation *in_stack_00000600;
  uint in_stack_ffffffffffffffa8;
  Kind in_stack_ffffffffffffffac;
  Indent in_stack_ffffffffffffffb8;
  Indent in_stack_ffffffffffffffc0;
  __normal_iterator<jsonnet::internal::ComprehensionSpec_*,_std::vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>_>
  local_28 [5];
  
  local_28[0]._M_current =
       (ComprehensionSpec *)
       std::
       vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
       ::begin((vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
                *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  std::
  vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
  ::end((vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
         *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<jsonnet::internal::ComprehensionSpec_*,_std::vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>_>
                             *)in_RDI,
                            (__normal_iterator<jsonnet::internal::ComprehensionSpec_*,_std::vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>_>
                             *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8)), bVar1
        ) {
    this_00 = __gnu_cxx::
              __normal_iterator<jsonnet::internal::ComprehensionSpec_*,_std::vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>_>
              ::operator*(local_28);
    fill(in_RDI,(Fodder *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),false,false,
         0x2cd4af);
    in_stack_ffffffffffffffac = this_00->kind;
    if (in_stack_ffffffffffffffac == FOR) {
      in_RDI->column = in_RDI->column + 3;
      fill(in_RDI,(Fodder *)(ulong)in_stack_ffffffffffffffa8,false,false,0x2cd4fe);
      sVar2 = std::__cxx11::
              basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::length
                        (&this_00->var->name);
      in_RDI->column = in_RDI->column + (int)sVar2;
      fill(in_RDI,(Fodder *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),false,
           false,0x2cd53b);
      in_RDI->column = in_RDI->column + 2;
      internal::open_fodder((AST *)0x2cd557);
      in_stack_ffffffffffffffc0 =
           newIndent((FixIndentation *)this_00,(Fodder *)in_stack_ffffffffffffffc0,
                     (Indent *)in_stack_ffffffffffffffb8,(uint)((ulong)in_RDI >> 0x20));
      expr(in_stack_00000600,in_stack_000005f8,in_stack_000005f0,(bool)in_stack_000005ef);
    }
    else if (in_stack_ffffffffffffffac == IF) {
      in_RDI->column = in_RDI->column + 2;
      internal::open_fodder((AST *)0x2cd5ac);
      in_stack_ffffffffffffffb8 =
           newIndent((FixIndentation *)this_00,(Fodder *)in_stack_ffffffffffffffc0,
                     (Indent *)in_stack_ffffffffffffffb8,(uint)((ulong)in_RDI >> 0x20));
      expr(in_stack_00000600,in_stack_000005f8,in_stack_000005f0,(bool)in_stack_000005ef);
    }
    __gnu_cxx::
    __normal_iterator<jsonnet::internal::ComprehensionSpec_*,_std::vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>_>
    ::operator++(local_28);
  }
  return;
}

Assistant:

void specs(std::vector<ComprehensionSpec> &specs, const Indent &indent)
    {
        for (auto &spec : specs) {
            fill(spec.openFodder, true, true, indent.lineUp);
            switch (spec.kind) {
                case ComprehensionSpec::FOR: {
                    column += 3;  // for
                    fill(spec.varFodder, true, true, indent.lineUp);
                    column += spec.var->name.length();
                    fill(spec.inFodder, true, true, indent.lineUp);
                    column += 2;  // in
                    Indent new_indent = newIndent(open_fodder(spec.expr), indent, column);
                    expr(spec.expr, new_indent, true);
                } break;

                case ComprehensionSpec::IF: {
                    column += 2;  // if
                    Indent new_indent = newIndent(open_fodder(spec.expr), indent, column);
                    expr(spec.expr, new_indent, true);
                } break;
            }
        }
    }